

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialIntegerAttributeDecoder::TransformAttributeToOriginalFormat
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids)

{
  uint16_t uVar1;
  int iVar2;
  PointCloudDecoder *pPVar3;
  size_type sVar4;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RSI;
  SequentialAttributeDecoder *in_RDI;
  
  pPVar3 = SequentialAttributeDecoder::decoder(in_RDI);
  if (pPVar3 != (PointCloudDecoder *)0x0) {
    pPVar3 = SequentialAttributeDecoder::decoder(in_RDI);
    uVar1 = PointCloudDecoder::bitstream_version(pPVar3);
    if (uVar1 < 0x200) {
      return true;
    }
  }
  sVar4 = std::
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          ::size(in_RSI);
  iVar2 = (*in_RDI->_vptr_SequentialAttributeDecoder[0xc])(in_RDI,sVar4 & 0xffffffff);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool SequentialIntegerAttributeDecoder::TransformAttributeToOriginalFormat(
    const std::vector<PointIndex> &point_ids) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder() &&
      decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    return true;  // Don't revert the transform here for older files.
  }
#endif
  return StoreValues(static_cast<uint32_t>(point_ids.size()));
}